

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.hpp
# Opt level: O2

void __thiscall
kainjow::mustache::
basic_mustache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
render(basic_mustache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *this,render_handler *handler,
      context_internal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      *ctx,bool root_renderer)

{
  walk_callback wStack_68;
  anon_class_24_3_6f1512f8 local_48;
  
  local_48.handler = handler;
  local_48.ctx = ctx;
  local_48.this = this;
  std::
  function<kainjow::mustache::component<std::__cxx11::string>::walk_control(kainjow::mustache::component<std::__cxx11::string>&)>
  ::
  function<kainjow::mustache::basic_mustache<std::__cxx11::string>::render(std::function<void(std::__cxx11::string_const&)>const&,kainjow::mustache::context_internal<std::__cxx11::string>&,bool)::_lambda(kainjow::mustache::component<std::__cxx11::string>&)_1_,void>
            ((function<kainjow::mustache::component<std::__cxx11::string>::walk_control(kainjow::mustache::component<std::__cxx11::string>&)>
              *)&wStack_68,&local_48);
  component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  walk_children(&this->root_component_,&wStack_68);
  Catch::clara::std::_Function_base::~_Function_base(&wStack_68.super__Function_base);
  if (root_renderer) {
    render_current_line(this,handler,ctx,
                        (component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)0x0);
  }
  return;
}

Assistant:

void render(const render_handler& handler, context_internal<string_type>& ctx, bool root_renderer = true) {
        root_component_.walk_children([&handler, &ctx, this](component<string_type>& comp) -> typename component<string_type>::walk_control {
            return render_component(handler, ctx, comp);
        });
        // process the last line, but only for the top-level renderer
        if (root_renderer) {
            render_current_line(handler, ctx, nullptr);
        }
    }